

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

cmDocumentationEntry * cmGlobalGhsMultiGenerator::GetDocumentation(void)

{
  char *pcVar1;
  cmDocumentationEntry *in_RDI;
  size_type __dnew;
  size_type local_20;
  
  (in_RDI->Name)._M_dataplus._M_p = (pointer)&(in_RDI->Name).field_2;
  local_20 = 0x11;
  pcVar1 = (char *)std::__cxx11::string::_M_create((ulong *)in_RDI,(ulong)&local_20);
  (in_RDI->Name)._M_dataplus._M_p = pcVar1;
  (in_RDI->Name).field_2._M_allocated_capacity = local_20;
  builtin_strncpy(pcVar1,"Green Hills MULTI",0x11);
  (in_RDI->Name)._M_string_length = local_20;
  (in_RDI->Name)._M_dataplus._M_p[local_20] = '\0';
  (in_RDI->Brief)._M_dataplus._M_p = (pointer)&(in_RDI->Brief).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&in_RDI->Brief,
             "Generates Green Hills MULTI files (experimental, work-in-progress).","");
  in_RDI->CustomNamePrefix = ' ';
  return in_RDI;
}

Assistant:

cmDocumentationEntry cmGlobalGhsMultiGenerator::GetDocumentation()
{
  return {
    GetActualName(),
    "Generates Green Hills MULTI files (experimental, work-in-progress)."
  };
}